

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  istream *piVar2;
  allocator local_31;
  string local_30 [8];
  string line;
  
  init_step();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              while( true ) {
                piVar2 = std::operator>>((istream *)&std::cin,local_30);
                bVar1 = std::ios::operator_cast_to_bool
                                  ((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
                if ((((!bVar1) ||
                     (bVar1 = std::operator==("Logout",(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_30), bVar1)) ||
                    (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_30,"Exit"), bVar1)) ||
                   ((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_30,"exit"), bVar1 ||
                    (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_30,"out"), bVar1)))) goto LAB_0010483b;
                bVar1 = std::operator==("Login",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)local_30);
                if (!bVar1) break;
                Login();
              }
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_30,"GetStudent");
              if (!bVar1) break;
              GetStudent();
            }
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_30,"GetAdmin");
            if (!bVar1) break;
            GetAdmin();
          }
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_30,"GetLabEmployees");
          if (!bVar1) break;
          GetLabEmployees();
        }
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_30,"GetProfessor");
        if (!bVar1) break;
        GetProfessor();
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_30,"AddNewUser");
      if (!bVar1) break;
      AddNewUser();
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_30,"Exit");
    if (bVar1) break;
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_30,"AddNewRoom");
    if (bVar1) {
      AddNewRoom();
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_30,"CanUserEnter");
      if (bVar1) {
        CanUserEnter();
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_30,"AddSpecialAccess");
        if (bVar1) {
          AddSpecialAccess();
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_30,"RemoveSpecialAccess");
          if (bVar1) {
            RemoveSpecialAccess();
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_30,"ChangeGroupsForLabEmployees");
            if (bVar1) {
              ChangeGroupsForLabEmployees();
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_30,"ChangeGroupForStudent");
              if (bVar1) {
                ChangeGroupForStudent();
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_30,"ShowAllUsers");
                if (bVar1) {
                  ShowAllUsers();
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_30,"ShowAllRooms");
                  if (bVar1) {
                    ShowAllRooms();
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0010483b:
  std::__cxx11::string::~string(local_30);
  return 0;
}

Assistant:

int main() {
    init_step();
    string line = "";
    while(cin>>line) {
        if("Logout" == line||line == "Exit"||line == "exit" || line == "out"){
            return 0;
        }else if("Login" == line){
            Login();
        }else if(line == "GetStudent"){
            GetStudent();
        }else if(line == "GetAdmin"){
            GetAdmin();
        }else if(line == "GetLabEmployees"){
            GetLabEmployees();
        }else if(line == "GetProfessor"){
            GetProfessor();
        }else if(line  == "AddNewUser"){
            AddNewUser();
        }else if(line == "Exit"){
            return 0;
        }else if(line  == "AddNewRoom"){
            AddNewRoom();
        }else if(line == "CanUserEnter"){
            CanUserEnter();
        }else if(line == "AddSpecialAccess"){
            AddSpecialAccess();
        }else if(line == "RemoveSpecialAccess"){
            RemoveSpecialAccess();
        }else if(line == "ChangeGroupsForLabEmployees"){
            ChangeGroupsForLabEmployees();
        }else if(line == "ChangeGroupForStudent"){
            ChangeGroupForStudent();
        }else if(line == "ShowAllUsers"){
            ShowAllUsers();
        }else if(line == "ShowAllRooms"){
            ShowAllRooms();
        }



    }

    return 0;
}